

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

bool __thiscall
S2Builder::EdgeChainSimplifier::InteriorVertexMatcher::Matches(InteriorVertexMatcher *this)

{
  bool bVar1;
  
  bVar1 = false;
  if ((this->too_many_endpoints_ == false) && (bVar1 = false, this->excess_out_ == 0)) {
    if (this->n1_ != this->n2_) {
      return false;
    }
    bVar1 = 0 < this->n1_ || this->n0_ == 0;
  }
  return bVar1;
}

Assistant:

bool Matches() const {
    // We check that there are the same number of incoming and outgoing edges
    // in each direction by verifying that (1) indegree(v0) == outdegree(v0)
    // and (2) the total number of edges (incoming and outgoing) to "v1" and
    // "v2" are equal.  We also check the condition on degenerate edges that
    // is documented above.
    return (!too_many_endpoints_ && excess_out_ == 0 && n1_ == n2_ &&
            (n0_ == 0 || n1_ > 0));
  }